

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

uint32_t __thiscall AmpIO::ReadSafetyAmpDisable(AmpIO *this)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar1 == 0x514c4131) {
    uVar1 = BoardIO::ReadStatus((BoardIO *)this);
    uVar2 = uVar1 >> 4 & 0xf;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ReadSafetyAmpDisable not implemented for this hardware",0x36);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

uint32_t AmpIO::ReadSafetyAmpDisable(void) const
{
    uint32_t val = 0;
    if (GetHardwareVersion() == QLA1_String) {
        // This field has been present in the Status register since Firmware Rev 3
        // (Firmware Rev 2 used register 11 and Firmware Rev 1 did not have this field)
        val = (ReadStatus()&0x000000F0) >> 4;
    }
    else {
        // This could be implemented by issuing NumMotors quadlet reads
        std::cerr << "ReadSafetyAmpDisable not implemented for this hardware" << std::endl;
    }
    return val;
}